

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_nex.cpp
# Opt level: O1

void dirNexPaletteBmp(void)

{
  bool bVar1;
  int iVar2;
  fullpath_ref_t __file;
  int __oflag;
  int __fd;
  SBmpFile bmp;
  SBmpFile SStack_68;
  
  __file = GetInputFile(&lp);
  if ((__file->full)._M_pathname._M_string_length != 0) {
    bVar1 = comma(&lp);
    if (!bVar1) {
      SStack_68.colorsUsed = 0;
      SStack_68.palBuffer = (byte *)0x0;
      SStack_68._72_5_ = 0;
      SStack_68.width._1_3_ = 0;
      SStack_68.height = 0;
      SStack_68.upsideDown = false;
      iVar2 = SBmpFile::open(&SStack_68,(char *)__file,__oflag);
      __fd = (int)__file;
      if ((char)iVar2 != '\0') {
        dirNexPaletteBmp(&SStack_68);
      }
      SBmpFile::close(&SStack_68,__fd);
      return;
    }
  }
  Error("[SAVENEX] expected syntax is BMP <filename>",bp,SUPPRESS);
  return;
}

Assistant:

static void dirNexPaletteBmp() {
// ;; SAVENEX PALETTE BMP <filename>
	fullpath_ref_t bmpIn = GetInputFile(lp);
	if (bmpIn.full.empty() || comma(lp)) {
		Error("[SAVENEX] expected syntax is BMP <filename>", bp, SUPPRESS);
		return;
	}
	// try to open the actual BMP file
	SBmpFile bmp;
	if (!bmp.open(bmpIn)) return;
	// check the palette if it was requested from this bmp and process it
	dirNexPaletteBmp(bmp);
}